

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laszip_dll.cpp
# Opt level: O1

laszip_I32 laszip_close_reader(laszip_POINTER pointer)

{
  LASreadPoint *this;
  LASindex *this_00;
  BOOL BVar1;
  laszip_I32 lVar2;
  
  lVar2 = 1;
  if (pointer != (laszip_POINTER)0x0) {
    if (*(LASreadPoint **)((long)pointer + 0x228) == (LASreadPoint *)0x0) {
      builtin_strncpy((char *)((long)pointer + 600),"efore it",8);
      builtin_strncpy((char *)((long)pointer + 0x260)," was ope",8);
      builtin_strncpy((char *)((long)pointer + 0x248),"closing ",8);
      builtin_strncpy((char *)((long)pointer + 0x250),"reader b",8);
      *(undefined4 *)((long)pointer + 0x268) = 0x64656e;
    }
    else {
      BVar1 = LASreadPoint::done(*(LASreadPoint **)((long)pointer + 0x228));
      if (BVar1) {
        this = *(LASreadPoint **)((long)pointer + 0x228);
        if (this != (LASreadPoint *)0x0) {
          LASreadPoint::~LASreadPoint(this);
          operator_delete(this);
        }
        *(undefined8 *)((long)pointer + 0x228) = 0;
        if (*(void **)((long)pointer + 0x210) != (void *)0x0) {
          operator_delete__(*(void **)((long)pointer + 0x210));
        }
        *(undefined8 *)((long)pointer + 0x210) = 0;
        if (*(long **)((long)pointer + 0x220) != (long *)0x0) {
          (**(code **)(**(long **)((long)pointer + 0x220) + 0x70))();
        }
        *(undefined8 *)((long)pointer + 0x220) = 0;
        this_00 = *(LASindex **)((long)pointer + 0xa48);
        if (this_00 != (LASindex *)0x0) {
          LASindex::~LASindex(this_00);
          operator_delete(this_00);
          *(undefined8 *)((long)pointer + 0xa48) = 0;
        }
        if (*(FILE **)((long)pointer + 0x218) != (FILE *)0x0) {
          fclose(*(FILE **)((long)pointer + 0x218));
          *(undefined8 *)((long)pointer + 0x218) = 0;
        }
        *(undefined1 *)((long)pointer + 0x248) = 0;
        lVar2 = 0;
      }
      else {
        builtin_strncpy((char *)((long)pointer + 0x254),"eadPoint",8);
        builtin_strncpy((char *)((long)pointer + 0x25c)," failed",8);
        builtin_strncpy((char *)((long)pointer + 0x248),"done of ",8);
        builtin_strncpy((char *)((long)pointer + 0x250),"LASreadP",8);
      }
    }
  }
  return lVar2;
}

Assistant:

LASZIP_API laszip_I32
laszip_close_reader(
    laszip_POINTER                     pointer
)
{
  if (pointer == 0) return 1;
  laszip_dll_struct* laszip_dll = (laszip_dll_struct*)pointer;
  try
  {
    if (laszip_dll->reader == 0)
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "closing reader before it was opened");
      return 1;
    }

    if (!laszip_dll->reader->done())
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "done of LASreadPoint failed");
      return 1;
    }

    delete laszip_dll->reader;
    laszip_dll->reader = 0;

    delete [] laszip_dll->point_items;
    laszip_dll->point_items = 0;

    delete laszip_dll->streamin;
    laszip_dll->streamin = 0;

    if (laszip_dll->lax_index)
    {
      delete laszip_dll->lax_index;
      laszip_dll->lax_index = 0;
    }

    if (laszip_dll->file)
    {
      fclose(laszip_dll->file);
      laszip_dll->file = 0;
    }
  }
  catch (...)
  {
    snprintf(laszip_dll->error, sizeof(laszip_dll->error), "internal error in laszip_close_reader");
    return 1;
  }

  laszip_dll->error[0] = '\0';
  return 0;
}